

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::Triangle::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Triangle *this,
          ShapeSampleContext *ctx,Point2f u)

{
  uint uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined4 uVar10;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar11 [16];
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  byte bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  anon_struct_8_0_00000001_for___align aVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar43 [48];
  undefined1 auVar39 [64];
  undefined1 auVar41 [64];
  Float FVar44;
  Float FVar45;
  undefined4 uVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined8 in_XMM0_Qb;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [60];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  uint uVar89;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 in_ZMM20 [64];
  Point3f p;
  Float triPDF;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_108;
  Tuple3<pbrt::Point3,_float> local_a8;
  float local_9c;
  undefined1 local_98 [88];
  bool local_40;
  undefined1 auVar40 [64];
  undefined1 auVar42 [64];
  undefined1 auVar54 [56];
  undefined1 auVar59 [64];
  array<float,_3> aVar99;
  
  auVar34 = in_ZMM20._0_16_;
  local_128._8_8_ = in_XMM0_Qb;
  local_128._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  uVar4 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
  ;
  lVar25 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar22 = (long)this->triIndex;
  lVar27 = *(long *)(lVar25 + 8);
  lVar12 = *(long *)(lVar25 + 0x10);
  lVar23 = (long)*(int *)(lVar27 + lVar22 * 0xc);
  lVar26 = (long)*(int *)(lVar27 + 4 + lVar22 * 0xc);
  fVar75 = *(float *)(lVar12 + lVar23 * 0xc);
  uVar1 = *(uint *)(lVar12 + lVar26 * 0xc);
  auVar51 = ZEXT416(uVar1);
  lVar24 = (long)*(int *)(lVar27 + 8 + lVar22 * 0xc);
  local_138._8_8_ = 0;
  local_138._0_8_ = *(ulong *)(lVar12 + 4 + lVar23 * 0xc);
  local_148._8_8_ = 0;
  local_148._0_8_ = *(ulong *)(lVar12 + 4 + lVar26 * 0xc);
  uVar5 = *(ulong *)(lVar12 + lVar24 * 0xc);
  uVar89 = *(uint *)(lVar12 + 8 + lVar24 * 0xc);
  auVar33 = ZEXT416(uVar89);
  auVar31._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar31._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar31._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar31._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  auVar31 = vinsertps_avx(auVar31,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar32._0_4_ = (float)uVar4 + auVar31._0_4_;
  auVar32._4_4_ = (float)((ulong)uVar4 >> 0x20) + auVar31._4_4_;
  auVar32._8_4_ = auVar31._8_4_ + 0.0;
  auVar32._12_4_ = auVar31._12_4_ + 0.0;
  auVar38._8_4_ = 0x3f000000;
  auVar38._0_8_ = 0x3f0000003f000000;
  auVar38._12_4_ = 0x3f000000;
  auVar43 = in_ZmmResult._16_48_;
  auVar31 = vmulps_avx512vl(auVar32,auVar38);
  local_98._8_4_ =
       ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
       0.5;
  uVar4 = vmovlps_avx(auVar31);
  local_98._0_4_ = (undefined4)uVar4;
  local_98._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  FVar44 = SolidAngle(this,(Point3f *)local_98);
  if (0.0002 <= FVar44) {
    bVar28 = NAN(FVar44);
    bVar29 = FVar44 == 6.22;
    if (FVar44 <= 6.22) {
      uVar3 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
      uVar10 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
      auVar55._4_4_ = uVar10;
      auVar55._0_4_ = uVar3;
      auVar55._8_8_ = 0;
      fVar2 = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              low;
      uVar6 = *(ulong *)&(ctx->pi).super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar6;
      uVar7 = *(ulong *)&(ctx->pi).super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar7;
      FVar44 = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
               high;
      auVar32 = vxorps_avx512vl(auVar34,auVar34);
      auVar38 = vucomiss_avx512f(auVar32);
      auVar31 = vmovshdup_avx(auVar55);
      fVar50 = auVar31._0_4_;
      if (((!bVar29) || (auVar55 = vucomiss_avx512f(auVar32), !bVar29)) || (bVar28)) {
LAB_00271e1d:
        fVar2 = (fVar2 + (float)uVar6) * 0.5;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = uVar5;
        auVar34 = vpermi2ps_avx512vl(_DAT_0054e620,auVar63,ZEXT416((uint)FVar44));
        auVar35 = vsubss_avx512f(auVar19,ZEXT416((uint)fVar2));
        auVar76._4_4_ = fVar2;
        auVar76._0_4_ = fVar2;
        auVar76._8_4_ = fVar2;
        auVar76._12_4_ = fVar2;
        auVar64._0_4_ = auVar34._0_4_ + (float)uVar7;
        auVar64._4_4_ = auVar34._4_4_ + (float)(uVar7 >> 0x20);
        auVar64._8_4_ = auVar34._8_4_ + 0.0;
        auVar64._12_4_ = auVar34._12_4_ + 0.0;
        auVar16._8_4_ = 0x3f000000;
        auVar16._0_8_ = 0x3f0000003f000000;
        auVar16._12_4_ = 0x3f000000;
        auVar37 = vmulps_avx512vl(auVar64,auVar16);
        auVar34 = vmovshdup_avx512vl(auVar19);
        fVar47 = auVar35._0_4_;
        fVar2 = auVar34._0_4_ - auVar37._0_4_;
        auVar34 = vmovshdup_avx(auVar37);
        auVar36 = vsubps_avx(local_148,auVar37);
        auVar13 = vsubps_avx(local_138,auVar37);
        auVar37 = vsubss_avx512f(auVar33,auVar34);
        auVar70._0_4_ = auVar36._0_4_ * auVar36._0_4_;
        auVar70._4_4_ = auVar36._4_4_ * auVar36._4_4_;
        auVar70._8_4_ = auVar36._8_4_ * auVar36._8_4_;
        auVar70._12_4_ = auVar36._12_4_ * auVar36._12_4_;
        fVar49 = auVar37._0_4_;
        auVar34 = vinsertps_avx512f(ZEXT416((uint)fVar75),auVar51,0x10);
        auVar56 = vsubps_avx(auVar34,auVar76);
        auVar34 = ZEXT416((uint)(fVar47 * fVar47 + fVar2 * fVar2 + fVar49 * fVar49));
        auVar34 = vsqrtss_avx(auVar34,auVar34);
        fVar48 = auVar34._0_4_;
        auVar80._0_4_ = fVar47 / fVar48;
        auVar80._4_12_ = auVar35._4_12_;
        auVar87._0_4_ = fVar2 / fVar48;
        auVar87._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar83._0_4_ = fVar49 / fVar48;
        auVar83._4_12_ = auVar37._4_12_;
        auVar90._0_4_ = auVar13._0_4_ * auVar13._0_4_;
        auVar90._4_4_ = auVar13._4_4_ * auVar13._4_4_;
        auVar90._8_4_ = auVar13._8_4_ * auVar13._8_4_;
        auVar90._12_4_ = auVar13._12_4_ * auVar13._12_4_;
        auVar34 = vinsertps_avx(auVar90,auVar70,0x1c);
        auVar35 = vinsertps_avx(auVar70,auVar90,0x4c);
        auVar71._0_4_ = auVar56._0_4_ * auVar56._0_4_ + auVar34._0_4_ + auVar35._0_4_;
        auVar71._4_4_ = auVar56._4_4_ * auVar56._4_4_ + auVar34._4_4_ + auVar35._4_4_;
        auVar71._8_4_ = auVar56._8_4_ * auVar56._8_4_ + auVar34._8_4_ + auVar35._8_4_;
        auVar71._12_4_ = auVar56._12_4_ * auVar56._12_4_ + auVar34._12_4_ + auVar35._12_4_;
        auVar37 = vsqrtps_avx(auVar71);
        auVar34 = vmovshdup_avx(auVar37);
        auVar34 = vdivps_avx(auVar36,auVar34);
        auVar91._0_4_ = auVar55._0_4_ * auVar34._0_4_;
        auVar91._4_4_ = auVar55._4_4_ * auVar34._4_4_;
        auVar91._8_4_ = auVar55._8_4_ * auVar34._8_4_;
        auVar91._12_4_ = auVar55._12_4_ * auVar34._12_4_;
        uVar6 = CONCAT44(auVar91._4_4_,auVar91._0_4_);
        auVar96._0_8_ = uVar6 ^ 0x8000000080000000;
        auVar96._8_4_ = -auVar91._8_4_;
        auVar96._12_4_ = -auVar91._12_4_;
        auVar35 = vpermt2ps_avx512vl(auVar91,_DAT_00551cc0,auVar96);
        auVar35 = vfmadd231ps_fma(auVar35,auVar55,auVar34);
        uVar46 = auVar37._0_4_;
        auVar66._4_4_ = uVar46;
        auVar66._0_4_ = uVar46;
        auVar66._8_4_ = uVar46;
        auVar66._12_4_ = uVar46;
        auVar34 = vdivps_avx(auVar13,auVar66);
        auVar67._0_4_ = auVar55._0_4_ * auVar34._0_4_;
        auVar67._4_4_ = auVar55._4_4_ * auVar34._4_4_;
        auVar67._8_4_ = auVar55._8_4_ * auVar34._8_4_;
        auVar67._12_4_ = auVar55._12_4_ * auVar34._12_4_;
        uVar6 = CONCAT44(auVar67._4_4_,auVar67._0_4_);
        auVar92._0_8_ = uVar6 ^ 0x8000000080000000;
        auVar92._8_4_ = -auVar67._8_4_;
        auVar92._12_4_ = -auVar67._12_4_;
        auVar36 = vpermt2ps_avx512vl(auVar67,_DAT_00551cc0,auVar92);
        auVar93._8_4_ = 0x7fffffff;
        auVar93._0_8_ = 0x7fffffff7fffffff;
        auVar93._12_4_ = 0x7fffffff;
        auVar34 = vfmadd231ps_fma(auVar36,auVar55,auVar34);
        auVar35 = vhaddps_avx(auVar34,auVar35);
        auVar34 = vdivps_avx(auVar56,auVar37);
        uVar46 = auVar38._0_4_;
        auVar72._4_4_ = uVar46;
        auVar72._0_4_ = uVar46;
        auVar72._8_4_ = uVar46;
        auVar72._12_4_ = uVar46;
        auVar35 = vshufps_avx(auVar35,auVar35,0xe8);
        auVar36 = SUB6416(ZEXT464(0x3c23d70a),0);
        auVar34 = vfmadd213ps_fma(auVar72,auVar34,auVar35);
        auVar34 = vandps_avx(auVar93,auVar34);
        auVar17._8_4_ = 0x3c23d70a;
        auVar17._0_8_ = 0x3c23d70a3c23d70a;
        auVar17._12_4_ = 0x3c23d70a;
        uVar6 = vcmpps_avx512vl(auVar34,auVar17,0xe);
        auVar35 = vshufps_avx(auVar34,auVar34,0xf5);
        bVar18 = (byte)(uVar6 >> 1);
        auVar40._16_48_ = auVar43;
        auVar40._0_16_ = auVar36;
        auVar39._4_60_ = auVar40._4_60_;
        auVar39._0_4_ =
             (float)((uint)(bVar18 & 1) * auVar35._0_4_ + (uint)!(bool)(bVar18 & 1) * 0x3c23d70a);
        auVar37 = auVar39._0_16_;
        auVar35 = vfmadd213ss_fma(auVar87,auVar55,ZEXT416((uint)(auVar83._0_4_ * fVar50)));
        auVar31 = vfmsub213ss_fma(auVar83,auVar31,ZEXT416((uint)(auVar83._0_4_ * fVar50)));
        auVar31 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ + auVar31._0_4_)),auVar38,auVar80);
        fVar2 = auVar39._0_4_ + auVar39._0_4_;
        auVar31 = vandps_avx(auVar93,auVar31);
        auVar31 = vmaxss_avx(auVar31,auVar36);
        auVar42._16_48_ = auVar43;
        auVar42._0_16_ = auVar36;
        auVar41._4_60_ = auVar42._4_60_;
        auVar41._0_4_ =
             (float)((uint)((byte)uVar6 & 1) * auVar34._0_4_ +
                    (uint)!(bool)((byte)uVar6 & 1) * 0x3c23d70a);
        vmovshdup_avx(local_128);
        auVar38 = vucomiss_avx512f(auVar32);
        if (((!bVar29) || ((bVar28 || (fVar2 != 0.0)))) || (NAN(fVar2))) {
          fVar50 = auVar41._0_4_ + auVar31._0_4_;
          fVar47 = auVar38._0_4_;
          auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar47 * fVar50 * fVar50)),
                                    ZEXT416((uint)(fVar2 * fVar2)),ZEXT416((uint)(1.0 - fVar47)));
          if (auVar38._0_4_ < 0.0) {
            fVar48 = sqrtf(auVar38._0_4_);
            auVar31 = ZEXT416((uint)auVar31._0_4_);
          }
          else {
            auVar38 = vsqrtss_avx(auVar38,auVar38);
            fVar48 = auVar38._0_4_;
          }
          auVar32 = vminss_avx512f(SUB6416(ZEXT464(0x3f7fffff),0),
                                   ZEXT416((uint)((fVar47 * (fVar2 + fVar50)) / (fVar2 + fVar48))));
        }
        auVar34 = vmulss_avx512f(auVar32,auVar41._0_16_);
        auVar38 = ZEXT816(0) << 0x20;
        fVar50 = u.super_Tuple2<pbrt::Point2,_float>.x;
        auVar35 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar32);
        auVar34 = vfmadd231ss_fma(auVar34,auVar35,auVar37);
        fVar47 = auVar34._0_4_;
        if ((((fVar50 != 0.0) || (NAN(fVar50))) || (fVar47 != 0.0)) || (NAN(fVar47))) {
          auVar38 = vmulss_avx512f(auVar32,auVar31);
          auVar38 = vfmadd231ss_fma(auVar38,auVar35,auVar37);
          fVar48 = auVar38._0_4_;
          auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar48 * fVar48)),
                                    ZEXT416((uint)(fVar47 * fVar47)),ZEXT416((uint)(1.0 - fVar50)));
          if (auVar38._0_4_ < 0.0) {
            fVar49 = sqrtf(auVar38._0_4_);
            auVar31 = ZEXT416(auVar31._0_4_);
          }
          else {
            auVar38 = vsqrtss_avx(auVar38,auVar38);
            fVar49 = auVar38._0_4_;
          }
          auVar38 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                               ZEXT416((uint)((fVar50 * (fVar47 + fVar48)) / (fVar47 + fVar49))));
        }
        local_108 = 0.0;
        fVar50 = auVar38._0_4_;
        if (((0.0 <= fVar50) && (fVar50 <= 1.0)) &&
           ((vucomiss_avx512f(auVar32), fVar50 <= 1.0 &&
            (auVar32 = vucomiss_avx512f(ZEXT416(0x3f800000)), fVar50 <= 1.0)))) {
          fVar2 = fVar2 + auVar41._0_4_ + auVar31._0_4_;
          if ((fVar2 != 0.0) || (local_108 = 1.0, NAN(fVar2))) {
            auVar36 = vmulss_avx512f(auVar32,ZEXT416((uint)(1.0 - fVar50)));
            auVar34 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * auVar35._0_4_ * fVar50)),
                                      auVar37,ZEXT416((uint)(auVar35._0_4_ * (1.0 - fVar50))));
            auVar34 = vfmadd213ss_fma(auVar41._0_16_,auVar36,auVar34);
            auVar35 = vmulss_avx512f(auVar32,auVar38);
            auVar31 = vfmadd213ss_fma(auVar31,auVar35,auVar34);
            local_108 = (auVar31._0_4_ * 4.0) / fVar2;
          }
        }
        auVar11._0_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
        ;
        auVar11._4_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
        auVar11._8_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
        ;
        auVar11._12_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        auVar31 = vinsertps_avx512f(auVar38,auVar32,0x10);
        u.super_Tuple2<pbrt::Point2,_float> = auVar31._0_8_;
        auVar63._8_8_ = 0;
        auVar63._0_8_ =
             *(ulong *)&(ctx->pi).super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
        FVar45 = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                 .low;
        FVar44 = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                 .high;
        auVar31 = vinsertps_avx(auVar11,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                      high),0x10);
      }
      else {
        bVar28 = NAN(fVar50);
        bVar29 = fVar50 == 0.0;
        if ((!bVar29) || (bVar28)) goto LAB_00271e1d;
        auVar31 = vmovshdup_avx(auVar68);
        FVar45 = auVar31._0_4_;
        auVar31 = vinsertps_avx(ZEXT416((uint)fVar2),auVar68,0x1c);
        local_108 = 1.0;
      }
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar5;
      auVar52._0_4_ = auVar63._0_4_ + auVar31._0_4_;
      auVar52._4_4_ = auVar63._4_4_ + auVar31._4_4_;
      auVar52._8_4_ = auVar63._8_4_ + auVar31._8_4_;
      auVar52._12_4_ = auVar63._12_4_ + auVar31._12_4_;
      local_98._16_16_ = vmovlhps_avx512f(local_148,auVar98);
      auVar14._8_4_ = 0x3f000000;
      auVar14._0_8_ = 0x3f0000003f000000;
      auVar14._12_4_ = 0x3f000000;
      auVar31 = vmulps_avx512vl(auVar52,auVar14);
      uVar4 = vmovlps_avx(local_138);
      local_98._4_4_ = (undefined4)uVar4;
      local_98._8_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      p.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar31._0_8_;
      p.super_Tuple3<pbrt::Point3,_float>.z = (FVar45 + FVar44) * 0.5;
      auVar60 = (undefined1  [60])0x0;
      auVar54 = ZEXT856(auVar31._8_8_);
      local_98._0_4_ = fVar75;
      local_98._12_4_ = uVar1;
      local_98._32_4_ = uVar89;
      aVar99 = SampleSphericalTriangle((array<pbrt::Point3<float>,_3> *)local_98,p,u,&local_9c);
      auVar59._0_4_ = aVar99.values[2];
      auVar59._4_60_ = auVar60;
      auVar53._0_8_ = aVar99.values._0_8_;
      auVar53._8_56_ = auVar54;
      if ((local_9c != 0.0) || (NAN(local_9c))) {
        local_108 = local_9c * local_108;
        auVar84._8_4_ = 0x7fffffff;
        auVar84._0_8_ = 0x7fffffff7fffffff;
        auVar84._12_4_ = 0x7fffffff;
        auVar77._4_4_ = fVar75;
        auVar77._0_4_ = fVar75;
        auVar77._8_4_ = fVar75;
        auVar77._12_4_ = fVar75;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar5;
        auVar31 = vinsertps_avx512f(local_148,local_138,0x4c);
        fVar2 = aVar99.values[0];
        auVar81._0_4_ = auVar31._0_4_ * fVar2;
        auVar81._4_4_ = auVar31._4_4_ * aVar99.values[1];
        auVar81._8_4_ = auVar31._8_4_ * auVar54._0_4_;
        auVar81._12_4_ = auVar31._12_4_ * auVar54._4_4_;
        auVar34 = vmovshdup_avx(auVar81);
        auVar31 = vandps_avx(auVar84,auVar81);
        auVar38 = vandps_avx(auVar34,auVar84);
        auVar37 = vsubps_avx512vl(local_148,local_138);
        auVar35 = vmovshdup_avx(auVar53._0_16_);
        fVar47 = auVar35._0_4_;
        fVar50 = (1.0 - fVar2) - fVar47;
        auVar32 = vmulss_avx512f(auVar33,ZEXT416((uint)fVar50));
        auVar32 = vandps_avx(auVar84,auVar32);
        local_98._8_4_ = (auVar31._0_4_ + auVar38._0_4_ + auVar32._0_4_) * 3.57628e-07;
        auVar31 = vpermt2ps_avx512vl(local_138,SUB6416(ZEXT464(4),0),auVar77);
        auVar38 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),local_148,auVar51);
        auVar97._0_4_ = auVar38._0_4_ * fVar47;
        auVar97._4_4_ = auVar38._4_4_ * auVar35._4_4_;
        auVar97._8_4_ = auVar38._8_4_ * auVar35._8_4_;
        auVar97._12_4_ = auVar38._12_4_ * auVar35._12_4_;
        auVar94._0_4_ = auVar31._0_4_ * fVar2;
        auVar94._4_4_ = auVar31._4_4_ * fVar2;
        auVar94._8_4_ = auVar31._8_4_ * fVar2;
        auVar94._12_4_ = auVar31._12_4_ * fVar2;
        auVar31 = vandps_avx(auVar94,auVar84);
        auVar38 = vandps_avx(auVar97,auVar84);
        auVar73._4_4_ = fVar50;
        auVar73._0_4_ = fVar50;
        auVar73._8_4_ = fVar50;
        auVar73._12_4_ = fVar50;
        auVar32 = vmulps_avx512vl(auVar20,auVar73);
        auVar32 = vandps_avx(auVar32,auVar84);
        auVar85._0_4_ = auVar31._0_4_ + auVar38._0_4_ + auVar32._0_4_;
        auVar85._4_4_ = auVar31._4_4_ + auVar38._4_4_ + auVar32._4_4_;
        auVar85._8_4_ = auVar31._8_4_ + auVar38._8_4_ + auVar32._8_4_;
        auVar85._12_4_ = auVar31._12_4_ + auVar38._12_4_ + auVar32._12_4_;
        auVar15._8_4_ = 0x34c00005;
        auVar15._0_8_ = 0x34c0000534c00005;
        auVar15._12_4_ = 0x34c00005;
        auVar31 = vmulps_avx512vl(auVar85,auVar15);
        uVar4 = vmovlps_avx(auVar31);
        local_98._0_4_ = (undefined4)uVar4;
        local_98._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        auVar31 = vmulss_avx512f(auVar33,auVar59._0_16_);
        auVar57._4_4_ = auVar59._0_4_;
        auVar57._0_4_ = auVar59._0_4_;
        auVar57._8_4_ = auVar59._0_4_;
        auVar57._12_4_ = auVar59._0_4_;
        auVar38 = vmulps_avx512vl(auVar20,auVar57);
        local_a8.z = auVar31._0_4_ + auVar34._0_4_ + auVar81._0_4_;
        auVar58._0_4_ = auVar94._0_4_ + auVar97._0_4_ + auVar38._0_4_;
        auVar58._4_4_ = auVar94._4_4_ + auVar97._4_4_ + auVar38._4_4_;
        auVar58._8_4_ = auVar94._8_4_ + auVar97._8_4_ + auVar38._8_4_;
        auVar58._12_4_ = auVar94._12_4_ + auVar97._12_4_ + auVar38._12_4_;
        auVar31 = vblendps_avx(local_138,auVar77,2);
        auVar38 = vinsertps_avx(auVar77,local_138,0x4c);
        local_a8._0_8_ = vmovlps_avx(auVar58);
        auVar33 = vinsertps_avx512f(auVar33,auVar20,0x1c);
        auVar33 = vsubps_avx(auVar33,auVar38);
        lVar12 = *(long *)(lVar25 + 0x18);
        auVar38 = vmovshdup_avx(auVar33);
        auVar32 = vpermt2ps_avx512vl(auVar20,_DAT_0054e620,auVar51);
        auVar34 = ZEXT416((uint)(auVar37._0_4_ * auVar38._0_4_));
        auVar51 = vfnmadd213ss_fma(auVar38,auVar37,auVar34);
        auVar32 = vsubps_avx512vl(auVar32,auVar31);
        auVar38 = vmovshdup_avx(auVar32);
        auVar31 = vinsertps_avx(auVar32,auVar33,0x1c);
        auVar38 = vfmsub213ss_fma(auVar38,auVar32,auVar34);
        fVar75 = auVar38._0_4_ + auVar51._0_4_;
        auVar38 = vpermi2ps_avx512vl(_DAT_0054e650,auVar33,auVar37);
        auVar95._0_4_ = auVar32._0_4_ * auVar38._0_4_;
        auVar95._4_4_ = auVar32._4_4_ * auVar38._4_4_;
        auVar95._8_4_ = auVar32._8_4_ * auVar38._8_4_;
        auVar95._12_4_ = auVar32._12_4_ * auVar38._12_4_;
        auVar38 = vinsertps_avx(auVar32,auVar37,0x4c);
        auVar51 = vfmsub213ps_fma(auVar33,auVar37,auVar95);
        auVar31 = vfnmadd213ps_fma(auVar31,auVar38,auVar95);
        auVar78._0_4_ = auVar31._0_4_ + auVar51._0_4_;
        auVar78._4_4_ = auVar31._4_4_ + auVar51._4_4_;
        auVar78._8_4_ = auVar31._8_4_ + auVar51._8_4_;
        auVar78._12_4_ = auVar31._12_4_ + auVar51._12_4_;
        auVar86._0_4_ = auVar78._0_4_ * auVar78._0_4_;
        auVar86._4_4_ = auVar78._4_4_ * auVar78._4_4_;
        auVar86._8_4_ = auVar78._8_4_ * auVar78._8_4_;
        auVar86._12_4_ = auVar78._12_4_ * auVar78._12_4_;
        auVar31 = vhaddps_avx(auVar86,auVar86);
        auVar31 = ZEXT416((uint)(fVar75 * fVar75 + auVar31._0_4_));
        auVar31 = vsqrtss_avx(auVar31,auVar31);
        fVar48 = auVar31._0_4_;
        auVar88._4_4_ = fVar48;
        auVar88._0_4_ = fVar48;
        auVar88._8_4_ = fVar48;
        auVar88._12_4_ = fVar48;
        auVar82._0_4_ = fVar75 / fVar48;
        auVar82._4_12_ = SUB6012((undefined1  [60])0x0,0);
        local_138 = vdivps_avx(auVar78,auVar88);
        uVar89 = local_138._8_4_;
        uVar1 = local_138._12_4_;
        if (lVar12 == 0) {
          if (*(char *)(lVar25 + 0x38) != *(char *)(lVar25 + 0x39)) {
            local_138._0_8_ = local_138._0_8_ ^ 0x8000000080000000;
            local_138._8_4_ = uVar89 ^ 0x80000000;
            local_138._12_4_ = uVar1 ^ 0x80000000;
            auVar82._0_8_ = CONCAT44(0x80000000,auVar82._0_4_) ^ 0x80000000;
            auVar82._8_4_ = 0x80000000;
            auVar82._12_4_ = 0x80000000;
          }
          iVar30 = auVar82._0_4_;
        }
        else {
          lVar25 = (long)*(int *)(lVar27 + lVar22 * 0xc);
          lVar23 = (long)*(int *)(lVar27 + 4 + lVar22 * 0xc);
          lVar27 = (long)*(int *)(lVar27 + 8 + lVar22 * 0xc);
          auVar38 = vpermi2ps_avx512vl(_DAT_0054e620,local_138,auVar82);
          uVar4 = *(undefined8 *)(lVar12 + 4 + lVar25 * 0xc);
          uVar8 = *(undefined8 *)(lVar12 + 4 + lVar23 * 0xc);
          uVar9 = *(undefined8 *)(lVar12 + 4 + lVar27 * 0xc);
          auVar61._0_4_ = fVar2 * (float)uVar4 + fVar47 * (float)uVar8 + fVar50 * (float)uVar9;
          auVar61._4_4_ =
               fVar2 * (float)((ulong)uVar4 >> 0x20) + auVar35._4_4_ * (float)((ulong)uVar8 >> 0x20)
               + fVar50 * (float)((ulong)uVar9 >> 0x20);
          auVar61._8_4_ = fVar2 * 0.0 + auVar35._8_4_ * 0.0 + fVar50 * 0.0;
          auVar61._12_4_ = fVar2 * 0.0 + auVar35._12_4_ * 0.0 + fVar50 * 0.0;
          auVar31 = vmovshdup_avx(auVar61);
          fVar75 = auVar82._0_4_ * auVar31._0_4_;
          auVar74._0_4_ = -fVar75;
          auVar74._4_4_ = 0x80000000;
          auVar74._8_4_ = 0x80000000;
          auVar74._12_4_ = 0x80000000;
          auVar31 = vinsertps_avx(ZEXT416((uint)fVar75),auVar74,0x10);
          auVar31 = vfmadd231ps_fma(auVar31,auVar61,auVar38);
          auVar31 = vhaddps_avx(auVar31,auVar31);
          auVar31 = vfmadd231ss_fma(auVar31,local_138,
                                    ZEXT416((uint)(fVar2 * *(float *)(lVar12 + lVar25 * 0xc) +
                                                   fVar47 * *(float *)(lVar12 + lVar23 * 0xc) +
                                                  fVar50 * *(float *)(lVar12 + lVar27 * 0xc))));
          auVar62._0_12_ = ZEXT812(0);
          auVar62._12_4_ = 0;
          if (auVar31._0_4_ < 0.0) {
            local_138._0_8_ = local_138._0_8_ ^ 0x8000000080000000;
            local_138._8_4_ = uVar89 ^ 0x80000000;
            local_138._12_4_ = uVar1 ^ 0x80000000;
          }
          uVar4 = vcmpss_avx512f(auVar31,auVar62,1);
          bVar28 = (bool)((byte)uVar4 & 1);
          iVar30 = (uint)bVar28 * (int)-auVar82._0_4_ + (uint)!bVar28 * (int)auVar82._0_4_;
        }
        Point3fi::Point3fi((Point3fi *)__return_storage_ptr__,(Point3f *)&local_a8,
                           (Vector3f *)local_98);
        FVar44 = ctx->time;
        __return_storage_ptr__->set = true;
        *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar44;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0;
        *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = 0;
        uVar4 = vmovlps_avx(local_138);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar4;
        *(int *)((long)&__return_storage_ptr__->optionalValue + 0x30) = iVar30;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
        *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) =
             ZEXT816(0) << 0x20;
        goto LAB_002725f0;
      }
      goto LAB_002722db;
    }
  }
  Sample((optional<pbrt::ShapeSample> *)local_98,this,u);
  auVar31 = local_98._16_16_;
  if (local_40 == false) {
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
  }
  uVar8 = local_98._16_8_;
  local_98._24_4_ = ctx->time;
  auVar32 = local_98._16_16_;
  auVar33._4_4_ = local_98._4_4_;
  auVar33._0_4_ = local_98._0_4_;
  auVar33._8_4_ = local_98._8_4_;
  auVar33._12_4_ = local_98._12_4_;
  auVar51._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar51._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar51._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar51._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar4 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
  ;
  local_98._16_4_ = auVar31._0_4_;
  auVar38 = vinsertps_avx(auVar33,ZEXT416((uint)local_98._12_4_),0x10);
  auVar51 = vinsertps_avx(auVar51,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  local_98._20_4_ = auVar31._4_4_;
  fVar50 = ((float)local_98._16_4_ + (float)local_98._20_4_) * 0.5;
  auVar34._0_4_ = ((float)local_98._4_4_ + auVar38._0_4_) * 0.5;
  auVar34._4_4_ = ((float)local_98._8_4_ + auVar38._4_4_) * 0.5;
  auVar34._8_4_ = (auVar38._8_4_ + 0.0) * 0.5;
  auVar34._12_4_ = (auVar38._12_4_ + 0.0) * 0.5;
  auVar35._0_4_ = ((float)uVar4 + auVar51._0_4_) * 0.5;
  auVar35._4_4_ = ((float)((ulong)uVar4 >> 0x20) + auVar51._4_4_) * 0.5;
  auVar35._8_4_ = (auVar51._8_4_ + 0.0) * 0.5;
  auVar35._12_4_ = (auVar51._12_4_ + 0.0) * 0.5;
  fVar47 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
           + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             high) * 0.5;
  auVar38 = vsubps_avx(auVar34,auVar35);
  fVar2 = auVar38._0_4_;
  auVar37._0_4_ = fVar2 * fVar2;
  auVar37._4_4_ = auVar38._4_4_ * auVar38._4_4_;
  auVar37._8_4_ = auVar38._8_4_ * auVar38._8_4_;
  auVar37._12_4_ = auVar38._12_4_ * auVar38._12_4_;
  auVar31 = vhaddps_avx(auVar37,auVar37);
  fVar48 = fVar50 - fVar47;
  fVar75 = auVar31._0_4_ + fVar48 * fVar48;
  if ((fVar75 != 0.0) || (NAN(fVar75))) {
    auVar51 = vsqrtss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
    auVar36._8_4_ = 0x80000000;
    auVar36._0_8_ = 0x8000000080000000;
    auVar36._12_4_ = 0x80000000;
    auVar33 = vxorps_avx512vl(ZEXT416((uint)fVar48),auVar36);
    auVar31 = vsubps_avx(auVar35,auVar34);
    fVar47 = fVar47 - fVar50;
    auVar56._0_4_ = auVar31._0_4_ * auVar31._0_4_;
    auVar56._4_4_ = auVar31._4_4_ * auVar31._4_4_;
    auVar56._8_4_ = auVar31._8_4_ * auVar31._8_4_;
    auVar56._12_4_ = auVar31._12_4_ * auVar31._12_4_;
    auVar31 = vhaddps_avx(auVar56,auVar56);
    fVar75 = auVar51._0_4_;
    auVar69._0_4_ = auVar33._0_4_ / fVar75;
    auVar69._4_12_ = auVar33._4_12_;
    auVar79._0_4_ = fVar2 / fVar75;
    auVar79._4_12_ = auVar38._4_12_;
    auVar38 = vmovshdup_avx(auVar38);
    auVar65._0_4_ = auVar38._0_4_ / fVar75;
    auVar65._4_12_ = auVar38._4_12_;
    auVar51 = vfnmadd132ss_fma(auVar65,ZEXT416((uint)(auVar69._0_4_ * (float)local_98._48_4_)),
                               ZEXT416((uint)local_98._44_4_));
    auVar38 = vfmsub213ss_fma(auVar69,ZEXT416((uint)local_98._48_4_),
                              ZEXT416((uint)(auVar69._0_4_ * (float)local_98._48_4_)));
    auVar38 = vfnmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ + auVar38._0_4_)),auVar79,
                               ZEXT416((uint)local_98._40_4_));
    auVar13._8_4_ = 0x7fffffff;
    auVar13._0_8_ = 0x7fffffff7fffffff;
    auVar13._12_4_ = 0x7fffffff;
    auVar38 = vandps_avx512vl(auVar38,auVar13);
    local_108 = (float)local_98._80_4_ / (auVar38._0_4_ / (auVar31._0_4_ + fVar47 * fVar47));
    if (ABS(local_108) != INFINITY) {
      aVar21._4_4_ = local_98._4_4_;
      aVar21._0_4_ = local_98._0_4_;
      local_98._24_8_ = auVar32._8_8_;
      __return_storage_ptr__->set = local_40;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_98._64_8_;
      (__return_storage_ptr__->optionalValue).__align = aVar21;
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
           CONCAT44(local_98._12_4_,local_98._8_4_);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar8;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_98._24_8_;
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
           CONCAT44(local_98._36_4_,local_98._32_4_);
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
           CONCAT44(local_98._44_4_,local_98._40_4_);
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
           CONCAT44(local_98._52_4_,local_98._48_4_);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_98._56_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_98._72_8_;
LAB_002725f0:
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_108;
      return __return_storage_ptr__;
    }
  }
LAB_002722db:
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        // Use uniform area sampling for numerically unstable cases
        Float solidAngle = SolidAngle(ctx.p());
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Uniformly sample shape and compute incident direction _wi_
            pstd::optional<ShapeSample> ss = Sample(u);
            DCHECK(ss.has_value());
            ss->intr.time = ctx.time;
            Vector3f wi = ss->intr.p() - ctx.p();
            if (LengthSquared(wi) == 0)
                return {};
            wi = Normalize(wi);

            // Convert uniform area sample PDF in _ss_ to solid angle measure
            ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
            if (IsInf(ss->pdf))
                return {};

            return ss;
        }

        // Sample spherical triangle from reference point
        // Apply warp product sampling for cosine factor at reference point
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            u = SampleBilinear(u, w);
            DCHECK(u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1);
            pdf = BilinearPDF(u, w);
        }

        Float triPDF;
        pstd::array<Float, 3> b =
            SampleSphericalTriangle({p0, p1, p2}, ctx.p(), u, &triPDF);
        if (triPDF == 0)
            return {};
        pdf *= triPDF;

        // Compute error bounds _pError_ for sampled point on triangle
        Point3f pAbsSum = Abs(b[0] * p0) + Abs(b[1] * p1) + Abs((1 - b[0] - b[1]) * p2);
        Vector3f pError = Vector3f(gamma(6) * pAbsSum);

        // Return _ShapeSample_ for uniform solid angle sampled point on triangle
        Point3f p = b[0] * p0 + b[1] * p1 + b[2] * p2;
        // Compute surface normal for sampled point on triangle
        Normal3f n = Normalize(Normal3f(Cross(p1 - p0, p2 - p0)));
        if (mesh->n != nullptr) {
            Normal3f ns(b[0] * mesh->n[v[0]] + b[1] * mesh->n[v[1]] +
                        (1 - b[0] - b[1]) * mesh->n[v[2]]);
            n = FaceForward(n, ns);
        } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;

        return ShapeSample{Interaction(Point3fi(p, pError), n, ctx.time), pdf};
    }